

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep.c
# Opt level: O0

int sprkStep_Init(ARKodeMem ark_mem,sunrealtype tout,int init_type)

{
  ARKodeSPRKTable pAVar1;
  ulong uVar2;
  int in_ESI;
  ARKodeMem in_RDI;
  int retval;
  ARKodeSPRKStepMem step_mem;
  ARKodeSPRKStepMem *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  long *plVar3;
  int local_4;
  
  plVar3 = (long *)0x0;
  local_4 = sprkStep_AccessStepMem
                      ((ARKodeMem)0x0,(char *)(ulong)in_stack_ffffffffffffffd0,
                       in_stack_ffffffffffffffc8);
  if (local_4 == 0) {
    if (in_ESI == 1) {
      local_4 = 0;
    }
    else {
      if ((in_ESI == 0) && (*plVar3 == 0)) {
        uVar2 = (ulong)((int)plVar3[1] - 1);
        switch(uVar2) {
        case 0:
          pAVar1 = ARKodeSPRKTable_Load(ARKODE_MIN_SPRK_NUM);
          *plVar3 = (long)pAVar1;
          break;
        case 1:
          pAVar1 = ARKodeSPRKTable_Load(ARKODE_MIN_SPRK_NUM);
          *plVar3 = (long)pAVar1;
          break;
        case 2:
          pAVar1 = ARKodeSPRKTable_Load(ARKODE_MIN_SPRK_NUM);
          *plVar3 = (long)pAVar1;
          break;
        case 3:
          pAVar1 = ARKodeSPRKTable_Load(ARKODE_MIN_SPRK_NUM);
          *plVar3 = (long)pAVar1;
          break;
        case 4:
          pAVar1 = ARKodeSPRKTable_Load(ARKODE_MIN_SPRK_NUM);
          *plVar3 = (long)pAVar1;
          break;
        case 5:
          pAVar1 = ARKodeSPRKTable_Load(ARKODE_MIN_SPRK_NUM);
          *plVar3 = (long)pAVar1;
          break;
        case 6:
        case 7:
          pAVar1 = ARKodeSPRKTable_Load(ARKODE_MIN_SPRK_NUM);
          *plVar3 = (long)pAVar1;
          break;
        case 8:
        case 9:
          pAVar1 = ARKodeSPRKTable_Load(ARKODE_MIN_SPRK_NUM);
          *plVar3 = (long)pAVar1;
          break;
        default:
          arkProcessError(in_RDI,99,0x196,"sprkStep_Init",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                          ,"No SPRK method at requested order, using q=4.");
          pAVar1 = ARKodeSPRKTable_Load((ARKODE_SPRKMethodID)(uVar2 >> 0x20));
          *plVar3 = (long)pAVar1;
        }
      }
      if ((*(int *)*plVar3 < 2) || (in_RDI->interp_degree <= *(int *)*plVar3 + -1)) {
        if ((*(int *)*plVar3 == 1) && (1 < in_RDI->interp_degree)) {
          in_RDI->interp_degree = 1;
        }
      }
      else {
        in_RDI->interp_degree = *(int *)*plVar3 + -1;
      }
      if (in_RDI->use_compensated_sums != 0) {
        N_VConst(0,plVar3[3]);
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int sprkStep_Init(ARKodeMem ark_mem, SUNDIALS_MAYBE_UNUSED sunrealtype tout,
                  int init_type)
{
  ARKodeSPRKStepMem step_mem = NULL;
  int retval                 = 0;

  /* access ARKodeSPRKStepMem structure */
  retval = sprkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* immediately return if reset */
  if (init_type == RESET_INIT) { return (ARK_SUCCESS); }

  /* initializations/checks for (re-)initialization call */
  if (init_type == FIRST_INIT)
  {
    if (!step_mem->method)
    {
      switch (step_mem->q)
      {
      case 1:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_1);
        break;
      case 2:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_2);
        break;
      case 3:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_3);
        break;
      case 4:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_4);
        break;
      case 5:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_5);
        break;
      case 6:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_6);
        break;
      case 7:
      case 8:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_8);
        break;
      case 9:
      case 10:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_10);
        break;
      default:
        arkProcessError(ark_mem, ARK_WARNING, __LINE__, __func__, __FILE__,
                        "No SPRK method at requested order, using q=4.");
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_4);
        break;
      }
    }
  }

  /* Override the interpolant degree (if needed), used in arkInitialSetup */
  if (step_mem->method->q > 1 &&
      ark_mem->interp_degree > (step_mem->method->q - 1))
  {
    /* Limit max degree to at most one less than the method global order */
    ark_mem->interp_degree = step_mem->method->q - 1;
  }
  else if (step_mem->method->q == 1 && ark_mem->interp_degree > 1)
  {
    /* Allow for linear interpolant with first order methods to ensure
       solution values are returned at the time interval end points */
    ark_mem->interp_degree = 1;
  }

  /* Zero yerr for compensated summation */
  if (ark_mem->use_compensated_sums) { N_VConst(ZERO, step_mem->yerr); }

  return (ARK_SUCCESS);
}